

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack13_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  auVar4 = _DAT_00194340;
  auVar8 = *(undefined1 (*) [16])(in + 1);
  auVar11 = vbroadcasti64x4_avx512f(_DAT_00194320);
  uVar2 = *in;
  uVar1 = *(ulong *)(in + 5);
  auVar18._16_16_ = _DAT_00197600;
  auVar18._0_16_ = _DAT_00197600;
  auVar17 = vpsllvd_avx2(auVar8,_DAT_00197590);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar7 = vpsllvd_avx2(auVar16,_DAT_001975b0);
  auVar17 = vpand_avx(auVar17,_DAT_001975a0);
  auVar5._8_4_ = 0x1ff0;
  auVar5._0_8_ = 0x1c0000001ff0;
  auVar5._12_4_ = 0x1c00;
  auVar7 = vpandq_avx512vl(auVar7,auVar5);
  *out = uVar2 & 0x1fff;
  uVar3 = in[7];
  auVar11 = vpermi2d_avx512f(auVar11,ZEXT1664(auVar8),ZEXT464(uVar2));
  auVar12 = vpmovsxbd_avx512f(_DAT_00197620);
  auVar11 = vpermi2d_avx512f(auVar12,auVar11,ZEXT864(uVar1));
  auVar12 = vpmovsxbd_avx512f(_DAT_00197630);
  auVar11 = vpsrlvd_avx512f(auVar11,_DAT_001a9440);
  auVar13 = vpbroadcastd_avx512f(ZEXT416(0x1fff));
  auVar8 = vpshufd_avx(auVar16,0x55);
  auVar8 = vpinsrd_avx(auVar8,uVar3,1);
  uVar1 = *(ulong *)(in + 10);
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT1664(auVar17),ZEXT1664(auVar7));
  auVar14 = vpandd_avx512f(auVar11,auVar13);
  auVar9 = vpbroadcastd_avx512vl();
  auVar11 = vpord_avx512f(auVar11,auVar12);
  auVar12._4_4_ = auVar11._4_4_;
  auVar12._0_4_ = auVar14._0_4_;
  auVar12._8_4_ = auVar14._8_4_;
  auVar12._12_4_ = auVar11._12_4_;
  auVar12._16_4_ = auVar14._16_4_;
  auVar12._20_4_ = auVar14._20_4_;
  auVar12._24_4_ = auVar11._24_4_;
  auVar12._28_4_ = auVar14._28_4_;
  auVar12._32_4_ = auVar11._32_4_;
  auVar12._36_4_ = auVar14._36_4_;
  auVar12._40_4_ = auVar14._40_4_;
  auVar12._44_4_ = auVar11._44_4_;
  auVar12._48_4_ = auVar14._48_4_;
  auVar12._52_4_ = auVar11._52_4_;
  auVar12._56_4_ = auVar14._56_4_;
  auVar12._60_4_ = auVar14._60_4_;
  auVar15._8_8_ = *(undefined8 *)(in + 8);
  auVar15._0_8_ = *(undefined8 *)(in + 8);
  auVar17 = vpmovsxbq_avx(ZEXT216(0x104));
  auVar11 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])(out + 1) = auVar11;
  auVar7 = vpsllvd_avx2(auVar15,_DAT_001975d0);
  auVar10 = vpermi2ps_avx512vl(auVar4,ZEXT1632(auVar15),ZEXT1632(auVar8));
  auVar4._8_4_ = 0x1f00;
  auVar4._0_8_ = 0x1f0000001f00;
  auVar4._12_4_ = 0x1f00;
  auVar4._16_4_ = 0x1f00;
  auVar4._20_4_ = 0x1f00;
  auVar4._24_4_ = 0x1f00;
  auVar4._28_4_ = 0x1f00;
  auVar9 = vpandd_avx512vl(auVar9,auVar4);
  auVar8 = vpermi2d_avx512vl(auVar17,auVar7,ZEXT416(uVar3 * 8));
  auVar8 = vpand_avx(auVar8,_DAT_001975f0);
  auVar17 = vpsrld_avx(auVar15,0x18);
  auVar4 = vpsrlvd_avx2(auVar10,_DAT_00194360);
  auVar10 = vpermi2d_avx512vl(auVar18,ZEXT1632(auVar8),ZEXT1632(auVar17));
  auVar9 = vpblendd_avx2(auVar4,auVar9,0x80);
  auVar4 = vpand_avx2(auVar4,auVar13._0_32_);
  uVar6 = (uint)(uVar1 >> 0x20);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8 = vpshufd_avx(auVar8,0x40);
  auVar9 = vpor_avx2(auVar10,auVar9);
  auVar4 = vpblendd_avx2(auVar9,auVar4,0x5a);
  *(undefined1 (*) [32])(out + 0x11) = auVar4;
  auVar7 = vpsrlvd_avx2(auVar8,_DAT_00197610);
  auVar17 = vpinsrd_avx(auVar13._0_16_,uVar6 * 2 & 0x1ffe,2);
  uVar2 = in[0xc];
  auVar8 = vpand_avx(auVar7,auVar13._0_16_);
  auVar17 = vpor_avx(auVar7,auVar17);
  auVar8 = vpblendd_avx2(auVar8,auVar17,4);
  *(undefined1 (*) [16])(out + 0x19) = auVar8;
  out[0x1d] = uVar6 >> 0x19 | (uVar2 & 0x3f) << 7;
  out[0x1e] = uVar2 >> 6 & 0x1fff;
  out[0x1f] = uVar2 >> 0x13;
  return in + 0xd;
}

Assistant:

const uint32_t *__fastunpack13_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 13);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 2)) << (13 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 13);
  out++;
  *out = ((*in) >> 15) % (1U << 13);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 9)) << (13 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 13);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 3)) << (13 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 13);
  out++;
  *out = ((*in) >> 16) % (1U << 13);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 10)) << (13 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 13);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 4)) << (13 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 13);
  out++;
  *out = ((*in) >> 17) % (1U << 13);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 11)) << (13 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 13);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 5)) << (13 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 13);
  out++;
  *out = ((*in) >> 18) % (1U << 13);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 12)) << (13 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 13);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 6)) << (13 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 13);
  out++;
  *out = ((*in) >> 19);
  ++in;
  out++;

  return in;
}